

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_suite.cpp
# Opt level: O0

void copy_string_to_array(void)

{
  type v;
  basic_variable<std::allocator<char>_> *lhs;
  undefined4 local_f4;
  size_type local_f0 [2];
  iterator local_e0;
  iterator local_c8;
  iterator local_b0;
  iterator local_98;
  nullable local_6c;
  undefined1 local_68 [8];
  variable result;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&result.storage.field_0x28,"alpha");
  local_6c = null;
  trial::dynamic::basic_array<std::allocator<char>_>::repeat<trial::dynamic::nullable>
            ((basic_variable<std::allocator<char>_> *)local_68,1,&local_6c);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_b0,(basic_variable<std::allocator<char>_> *)&result.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_c8,(basic_variable<std::allocator<char>_> *)&result.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_e0,(basic_variable<std::allocator<char>_> *)local_68);
  std::
  copy<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            (&local_98,&local_b0,&local_c8,&local_e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b0);
  local_f0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                          ((basic_variable<std::allocator<char>_> *)local_68);
  local_f4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/copy_suite.cpp"
             ,0x3d,"void copy_string_to_array()",local_f0,&local_f4);
  lhs = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                  ((basic_variable<std::allocator<char>_> *)local_68,0);
  v = trial::dynamic::operator==(lhs,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("result[0] == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/copy_suite.cpp"
             ,0x3e,"void copy_string_to_array()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_68);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&result.storage.field_0x28);
  return;
}

Assistant:

void copy_string_to_array()
{
    variable data("alpha");
    variable result = array::repeat(1, null);
    std::copy(data.begin(), data.end(), result.begin());
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 1);
    TRIAL_PROTOCOL_TEST(result[0] == "alpha");
}